

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_stats.cpp
# Opt level: O3

void duckdb::ListStats::Construct(BaseStatistics *stats)

{
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> stats_00;
  undefined8 *puVar1;
  LogicalType *other;
  pointer __p;
  LogicalType LStack_38;
  __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_> local_20;
  
  puVar1 = (undefined8 *)operator_new__(0x60);
  *puVar1 = 1;
  BaseStatistics::BaseStatistics((BaseStatistics *)(puVar1 + 1));
  local_20._M_t.
  super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>.
  super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
       (tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>)
       (_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>)
       0x0;
  ::std::__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>::
  reset((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_> *)
        &stats->child_stats,(BaseStatistics *)(puVar1 + 1));
  ::std::unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>::
  ~unique_ptr((unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>
               *)&local_20);
  stats_00._M_head_impl =
       (stats->child_stats).
       super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
       .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
  other = ListType::GetChildType(&stats->type);
  LogicalType::LogicalType(&LStack_38,other);
  BaseStatistics::Construct(stats_00._M_head_impl,&LStack_38);
  LogicalType::~LogicalType(&LStack_38);
  return;
}

Assistant:

void ListStats::Construct(BaseStatistics &stats) {
	stats.child_stats = unsafe_unique_array<BaseStatistics>(new BaseStatistics[1]);
	BaseStatistics::Construct(stats.child_stats[0], ListType::GetChildType(stats.GetType()));
}